

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void xmlCleanupMutex(xmlMutexPtr mutex)

{
  xmlMutexPtr mutex_local;
  
  pthread_mutex_destroy((pthread_mutex_t *)mutex);
  return;
}

Assistant:

void
xmlCleanupMutex(xmlMutexPtr mutex)
{
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_destroy(&mutex->lock);
#elif defined HAVE_WIN32_THREADS
    DeleteCriticalSection(&mutex->cs);
#else
    (void) mutex;
#endif
}